

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8a74a::PedestrianPlugIn::redraw
          (PedestrianPlugIn *this,float currentTime,float elapsedTime)

{
  uint *puVar1;
  Pedestrian *pPVar2;
  undefined8 uVar3;
  AbstractVehicle *pAVar4;
  undefined4 uVar5;
  PedestrianPlugIn *pPVar6;
  Color CVar7;
  char cVar8;
  int iVar9;
  PolylineSegmentedPathwaySingleRadius *pPVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar11;
  long lVar12;
  Color *color;
  pointer ppPVar13;
  char *pcVar14;
  ulong uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vec3 VVar20;
  Color textColor;
  ostringstream status;
  float local_228;
  float fStack_224;
  float local_214;
  Vec3 local_210;
  Color local_200;
  PedestrianPlugIn *local_1f0;
  AbstractVehicle *local_1e8;
  AbstractVehicle *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Vec3 local_1c8;
  Color local_1b8;
  uint auStack_1a0 [22];
  ios_base local_148 [268];
  Vec3 local_3c;
  
  pAVar4 = OpenSteer::OpenSteerDemo::selectedVehicle;
  local_1e8 = OpenSteer::OpenSteerDemo::vehicleNearestToMouse();
  uVar16 = (ulong)(uint)elapsedTime;
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,pAVar4);
  if (OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) {
    (*(pAVar4->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar4);
    (this->gridCenter).x = (float)extraout_XMM0_Da;
    (this->gridCenter).y = (float)extraout_XMM0_Db;
    (this->gridCenter).z = (float)uVar16;
  }
  local_1e0 = pAVar4;
  OpenSteer::OpenSteerDemo::gridUtility(&this->gridCenter);
  ppPVar13 = (this->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar13 !=
      (this->crowd).
      super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pPVar2 = *ppPVar13;
      OpenSteer::drawBasic2dCircularVehicle((AbstractVehicle *)pPVar2,(Color *)OpenSteer::gGray50);
      local_1b8 = OpenSteer::grayColor(0.7);
      uVar16 = local_1b8._8_8_;
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
                ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pPVar2,
                 &local_1b8,(Color *)OpenSteer::gWhite);
      ppPVar13 = ppPVar13 + 1;
    } while (ppPVar13 !=
             (this->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1f0 = this;
  pPVar10 = getTestPath();
  iVar9 = (*(pPVar10->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])(pPVar10);
  if (1 < CONCAT44(extraout_var,iVar9)) {
    uVar15 = 1;
    do {
      (*(pPVar10->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar10,uVar15);
      CVar7 = local_1b8;
      local_1b8.g_ = (float)extraout_XMM0_Db_00;
      local_1b8.r_ = (float)extraout_XMM0_Da_00;
      local_1b8.a_ = CVar7.a_;
      local_1b8.b_ = (float)(int)uVar16;
      (*(pPVar10->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar10,uVar15 - 1);
      local_200.b_ = (float)uVar16;
      OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_200,(Color *)OpenSteer::gRed);
      iVar9 = (*(pPVar10->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])(pPVar10);
      uVar15 = uVar15 + 1;
    } while (uVar15 < CONCAT44(extraout_var_00,iVar9));
  }
  uVar5 = (anonymous_namespace)::gObstacle1._12_4_;
  if (OpenSteer::updatePhaseActive == '\x01') {
    OpenSteer::warnIfInUpdatePhase2("drawXZCircle");
  }
  OpenSteer::drawXZCircleOrDisk
            ((float)uVar5,(Vec3 *)((anonymous_namespace)::gObstacle1 + 0x10),
             (Color *)OpenSteer::gWhite,0x28,false);
  pAVar4 = local_1e0;
  uVar5 = (anonymous_namespace)::gObstacle2._12_4_;
  if (OpenSteer::updatePhaseActive == '\x01') {
    OpenSteer::warnIfInUpdatePhase2("drawXZCircle");
  }
  OpenSteer::drawXZCircleOrDisk
            ((float)uVar5,(Vec3 *)((anonymous_namespace)::gObstacle2 + 0x10),
             (Color *)OpenSteer::gWhite,0x28,false);
  CVar7 = local_1b8;
  fVar19 = (float)(anonymous_namespace)::gObstacle3._60_4_ * 0.5;
  fVar17 = fVar19 * (float)(anonymous_namespace)::gObstacle3._12_8_;
  fVar18 = fVar19 * SUB84((anonymous_namespace)::gObstacle3._12_8_,4);
  local_1b8.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + fVar18;
  local_1b8.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + fVar17;
  local_1b8.a_ = CVar7.a_;
  local_1b8.b_ = (float)(anonymous_namespace)::gObstacle3._56_4_ +
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar19;
  local_200.b_ = (float)(anonymous_namespace)::gObstacle3._56_4_ -
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar19;
  local_200.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) - fVar18;
  local_200.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ - fVar17;
  OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_200,(Color *)OpenSteer::gWhite);
  local_200.g_ = fVar19;
  local_200.r_ = fVar19;
  local_200.b_ = 0.0;
  VVar20 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      (Vec3 *)&local_200);
  local_1b8.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar20.y;
  local_1b8.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar20.x;
  local_1b8.b_ = VVar20.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_210.y = fVar19;
  local_210.x = -fVar19;
  local_210.z = 0.0;
  VVar20 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_210);
  local_200.b_ = VVar20.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_200.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar20.y;
  local_200.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar20.x;
  local_1c8._0_8_ = CONCAT44(fVar19,fVar19) ^ 0x8000000080000000;
  local_1c8.z = 0.0;
  VVar20 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_1c8);
  local_210.z = VVar20.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_210.y = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar20.y;
  local_210.x = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar20.x;
  local_3c.z = 0.0;
  local_3c.x = fVar19;
  local_3c.y = -fVar19;
  VVar20 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_3c);
  local_1c8.z = VVar20.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  uVar16 = (ulong)(uint)local_1c8.z;
  local_1c8.y = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar20.y;
  local_1c8.x = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar20.x;
  OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_200,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine((Vec3 *)&local_200,&local_210,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_210,&local_1c8,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_1c8,(Vec3 *)&local_1b8,(Color *)OpenSteer::gWhite);
  OpenSteer::OpenSteerDemo::highlightVehicleUtility(local_1e8);
  if ((OpenSteer::enableAnnotation == '\x01') &&
     (ppPVar13 = (local_1f0->crowd).
                 super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
     ppPVar13 !=
     (local_1f0->crowd).
     super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      fVar17 = (float)uVar16;
      pPVar2 = *ppPVar13;
      (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
      if (local_1e8 == (AbstractVehicle *)0x0) {
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_214 = 0.0;
        fVar18 = fVar17;
      }
      else {
        local_214 = fVar17;
        (*(local_1e8->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
        local_1d8 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        uStack_1d0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
        fVar18 = local_214;
      }
      (*(pAVar4->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar4);
      fVar18 = (fVar17 - fVar18) * (fVar17 - fVar18) +
               (extraout_XMM0_Da_01 - extraout_XMM0_Da_03) *
               (extraout_XMM0_Da_01 - extraout_XMM0_Da_03) +
               (extraout_XMM0_Db_01 - extraout_XMM0_Db_03) *
               (extraout_XMM0_Db_01 - extraout_XMM0_Db_03);
      if (fVar18 < 0.0) {
        fVar18 = sqrtf(fVar18);
      }
      else {
        fVar18 = SQRT(fVar18);
      }
      if (fVar18 < 6.0) {
LAB_0012aa02:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"#",1);
        cVar8 = std::ostream::operator<<
                          ((ostream *)&local_1b8,
                           *(int *)&(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.field_0x94);
        std::ostream::put(cVar8);
        fVar17 = 1.0;
        OpenSteer::Color::Color(&local_200,0.8,1.0,0.8,1.0);
        (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
          super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
          super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
        local_210.z = fVar17 + 0.0;
        local_210.y = extraout_XMM0_Db_04 + 0.25;
        local_210.x = extraout_XMM0_Da_04 + 0.0;
        fVar17 = OpenSteer::drawGetWindowWidth();
        fVar18 = OpenSteer::drawGetWindowHeight();
        uVar16 = (ulong)(uint)fVar18;
        OpenSteer::draw2dTextAt3dLocation
                  ((ostringstream *)&local_1b8,&local_210,&local_200,fVar17,fVar18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
        std::ios_base::~ios_base(local_148);
      }
      else {
        fVar17 = (fVar17 - local_214) * (fVar17 - local_214) +
                 (extraout_XMM0_Da_01 - (float)local_1d8) * (extraout_XMM0_Da_01 - (float)local_1d8)
                 + (extraout_XMM0_Db_01 - local_1d8._4_4_) * (extraout_XMM0_Db_01 - local_1d8._4_4_)
        ;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        uVar16 = 0x40c00000;
        if (fVar17 < 6.0) goto LAB_0012aa02;
      }
      ppPVar13 = ppPVar13 + 1;
    } while (ppPVar13 !=
             (local_1f0->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) &&
     (OpenSteer::enableAnnotation == '\x01')) {
    fVar18 = 0.8;
    OpenSteer::Color::Color(&local_200,0.8,0.8,1.0,1.0);
    (*(pAVar4->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar4);
    fVar17 = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.z;
    uVar3 = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position._0_8_;
    local_210.z = fVar18 + 0.0;
    local_210.y = extraout_XMM0_Db_05 + 0.25;
    local_210.x = extraout_XMM0_Da_05 + 0.0;
    fVar18 = local_210.z;
    (*(pAVar4->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar4);
    local_228 = (float)uVar3;
    fStack_224 = SUB84(uVar3,4);
    fVar17 = (fVar18 - fVar17) * (fVar18 - fVar17) +
             (extraout_XMM0_Da_06 - local_228) * (extraout_XMM0_Da_06 - local_228) +
             (extraout_XMM0_Db_06 - fStack_224) * (extraout_XMM0_Db_06 - fStack_224);
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    *(undefined8 *)((long)&local_1b8.b_ + *(long *)(local_1b8._0_8_ + -0x18)) = 2;
    puVar1 = (uint *)((long)auStack_1a0 + *(long *)(local_1b8._0_8_ + -0x18));
    *puVar1 = *puVar1 | 4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"1: speed: ",10);
    (*(pAVar4->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x1b])(pAVar4);
    poVar11 = std::ostream::_M_insert<double>((double)extraout_XMM0_Da_07);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    *(undefined8 *)((long)&local_1b8.b_ + *(long *)(local_1b8._0_8_ + -0x18)) = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"2: cam dist: ",0xd);
    poVar11 = std::ostream::_M_insert<double>((double)fVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"3: no third thing",0x11);
    std::ostream::put((char)&local_1b8);
    fVar17 = OpenSteer::drawGetWindowWidth();
    fVar18 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dTextAt3dLocation
              ((ostringstream *)&local_1b8,&local_210,&local_200,fVar17,fVar18);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
    std::ios_base::~ios_base(local_148);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,"[F1/F2] Crowd size: ",0x14);
  pPVar6 = local_1f0;
  std::ostream::operator<<((ostream *)&local_1b8,local_1f0->population);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F3] PD type: ",0xf);
  if (pPVar6->cyclePD == 0) {
    lVar12 = 0xe;
    pcVar14 = "LQ bin lattice";
  }
  else {
    if (pPVar6->cyclePD != 1) goto LAB_0012adcd;
    lVar12 = 0xb;
    pcVar14 = "brute force";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,pcVar14,lVar12);
LAB_0012adcd:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F4] ",6);
  pcVar14 = "Stay on the path.";
  if ((anonymous_namespace)::gUseDirectedPathFollowing != '\0') {
    pcVar14 = "Directed path following.";
  }
  lVar12 = 0x11;
  if ((anonymous_namespace)::gUseDirectedPathFollowing != '\0') {
    lVar12 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,pcVar14,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F5] Wander: ",0xe);
  pcVar14 = "no";
  if ((ulong)(anonymous_namespace)::gWanderSwitch != 0) {
    pcVar14 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,pcVar14,(ulong)(anonymous_namespace)::gWanderSwitch | 2);
  std::ios::widen((char)&local_1b8 + (char)*(undefined8 *)(local_1b8._0_8_ + -0x18));
  std::ostream::put((char)&local_1b8);
  std::ostream::flush();
  fVar17 = OpenSteer::drawGetWindowHeight();
  fVar18 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  VVar20.y = fVar17 + -50.0;
  VVar20.x = 10.0;
  VVar20.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)&local_1b8,(ostringstream *)OpenSteer::gGray80,VVar20,color,fVar18,fVar19)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
    {
        // selected Pedestrian (user can mouse click to select another)
        AbstractVehicle* selected = OpenSteerDemo::selectedVehicle;
        
        // Pedestrian nearest mouse (to be highlighted)
        AbstractVehicle* nearMouse = OpenSteerDemo::vehicleNearestToMouse ();
        
        // update camera
        OpenSteerDemo::updateCamera (currentTime, elapsedTime, selected);
        
        // draw "ground plane"
        if (OpenSteerDemo::selectedVehicle) gridCenter = selected->position();
        OpenSteerDemo::gridUtility (gridCenter);
        
        // draw and annotate each Pedestrian
        for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).draw (); 
        
        // draw the path they follow and obstacles they avoid
        drawPathAndObstacles ();
        
        // highlight Pedestrian nearest mouse
        OpenSteerDemo::highlightVehicleUtility (nearMouse);
        
        // textual annotation (at the vehicle's screen position)
        serialNumberAnnotationUtility (selected, nearMouse);
        
        // textual annotation for selected Pedestrian
        if (OpenSteerDemo::selectedVehicle && OpenSteer::annotationIsOn())
        {
            const Color color (0.8f, 0.8f, 1.0f);
            const Vec3 textOffset (0, 0.25f, 0);
            const Vec3 textPosition = selected->position() + textOffset;
            const Vec3 camPosition = OpenSteerDemo::camera.position();
            const float camDistance = Vec3::distance (selected->position(),
                                                      camPosition);
            const char* spacer = "      ";
            std::ostringstream annote;
            annote << std::setprecision (2);
            annote << std::setiosflags (std::ios::fixed);
            annote << spacer << "1: speed: " << selected->speed() << std::endl;
            annote << std::setprecision (1);
            annote << spacer << "2: cam dist: " << camDistance << std::endl;
            annote << spacer << "3: no third thing" << std::ends;
            draw2dTextAt3dLocation (annote, textPosition, color, drawGetWindowWidth(), drawGetWindowHeight());
        }
        
        // display status in the upper left corner of the window
        std::ostringstream status;
        status << "[F1/F2] Crowd size: " << population;
        status << "\n[F3] PD type: ";
        switch (cyclePD)
        {
            case 0: status << "LQ bin lattice"; break;
            case 1: status << "brute force";    break;
        }
        status << "\n[F4] ";
        if (gUseDirectedPathFollowing)
            status << "Directed path following.";
        else
            status << "Stay on the path.";
        status << "\n[F5] Wander: ";
        if (gWanderSwitch) status << "yes"; else status << "no";
        status << std::endl;
        const float h = drawGetWindowHeight ();
        const Vec3 screenLocation (10, h-50, 0);
        draw2dTextAt2dLocation (status, screenLocation, gGray80, drawGetWindowWidth(), drawGetWindowHeight());
    }